

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selist.c
# Opt level: O1

_Bool selist_set_insert(selist **qlp,void *data,cmp_cb cmp)

{
  selist *qlp_00;
  bool bVar1;
  int iVar2;
  byte unaff_BPL;
  code *cmp_00;
  ulong uVar3;
  selist *ql;
  
  qlp_00 = *qlp;
  if (qlp_00 != (selist *)0x0) {
    cmp_00 = cmp_voidptr;
    if (cmp != (cmp_cb)0x0) {
      cmp_00 = cmp;
    }
    if ((qlp_00->num_elements < 1) ||
       (iVar2 = (*cmp_00)(qlp_00->elements[qlp_00->num_elements - 1],data), -1 < iVar2)) {
      if (qlp_00->num_elements == 0) {
        bVar1 = true;
      }
      else {
        uVar3 = 0;
        do {
          iVar2 = (*cmp_00)(data,qlp_00->elements[uVar3]);
          if (iVar2 < 0) {
            selist_insert(qlp,(int)uVar3,data);
            unaff_BPL = 1;
          }
          else {
            unaff_BPL = unaff_BPL & iVar2 != 0;
          }
          bVar1 = 0 < iVar2;
        } while ((bVar1) && (uVar3 = uVar3 + 1, uVar3 != (uint)qlp_00->num_elements));
      }
    }
    else {
      if ((qlp_00->num_elements == 0xe) ||
         ((qlp_00->next != (selist *)0x0 &&
          (iVar2 = (*cmp_00)(qlp_00->next->elements[0],data), iVar2 < 1)))) {
        unaff_BPL = selist_set_insert(&qlp_00->next,data,cmp_00);
      }
      else {
        iVar2 = qlp_00->num_elements;
        qlp_00->num_elements = iVar2 + 1;
        qlp_00->elements[iVar2] = data;
        unaff_BPL = true;
      }
      bVar1 = false;
    }
    if (!bVar1) goto LAB_0010848f;
  }
  selist_push(qlp,data);
  unaff_BPL = 1;
LAB_0010848f:
  return (_Bool)(unaff_BPL & 1);
}

Assistant:

bool selist_set_insert(struct selist **qlp, void *data, cmp_cb cmp)
{
    if (*qlp) {
        selist *ql = *qlp;
        if (cmp==NULL) cmp = cmp_voidptr;
        if (ql->num_elements > 0 && cmp(ql->elements[ql->num_elements - 1], data) < 0) {
            if (ql->num_elements == LIST_MAXSIZE || (ql->next
                && cmp(ql->next->elements[0], data) <= 0)) {
                return selist_set_insert(&ql->next, data, cmp);
            }
            else {
                ql->elements[ql->num_elements++] = data;
            }
            return true;
        }
        else {
            int i;
            /* TODO: OPT | binary search */
            for (i = 0; i != ql->num_elements; ++i) {
                int cmpi = cmp(data, ql->elements[i]);
                if (cmpi < 0) {
                    selist_insert(qlp, i, data);
                    return true;
                }
                if (cmpi == 0) {
                    return false;
                }
            }
        }
    }
    selist_push(qlp, data);
    return true;
}